

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O3

void __thiscall
JsUtil::
WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>
::Initialize(WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>
             *this,int capacity)

{
  undefined1 auVar1 [16];
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  BOOL BVar5;
  Recycler *pRVar6;
  undefined4 *puVar7;
  int *__s;
  WeakRefDictionaryEntry<Js::EntryPointInfo,_unsigned_char> *pWVar8;
  Type *pTVar9;
  ulong uVar10;
  ulong uVar11;
  size_t sVar12;
  undefined4 uVar13;
  undefined4 uVar15;
  undefined8 extraout_XMM1_Qa;
  undefined1 in_XMM1 [16];
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  undefined8 extraout_XMM1_Qa_03;
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  undefined8 extraout_XMM1_Qb_01;
  undefined8 extraout_XMM1_Qb_02;
  undefined8 extraout_XMM1_Qb_03;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 local_68 [8];
  TrackAllocData data;
  int local_38;
  uint local_34;
  int modIndex;
  undefined1 auVar14 [16];
  
  local_38 = 0x4b;
  uVar4 = PrimePolicy::GetPrime(capacity,&local_38);
  uVar11 = (ulong)(int)uVar4;
  local_68 = (undefined1  [8])&int::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_18ff27;
  data.filename._0_4_ = 0x1bd;
  data.plusSize = uVar11;
  pRVar6 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_68);
  local_34 = uVar4;
  if (uVar4 == 0) {
    Memory::Recycler::ClearTrackAllocInfo(pRVar6,(TrackAllocData *)0x0);
    __s = (int *)&DAT_00000008;
  }
  else {
    sVar12 = 0xffffffffffffffff;
    if (-1 < (int)uVar4) {
      sVar12 = uVar11 * 4;
    }
    BVar5 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      in_XMM1._8_8_ = extraout_XMM1_Qb;
      in_XMM1._0_8_ = extraout_XMM1_Qa;
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_007c28ac;
      *puVar7 = 0;
      uVar4 = local_34;
    }
    __s = (int *)Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                           (pRVar6,sVar12);
    if (__s == (int *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      in_XMM1._8_8_ = extraout_XMM1_Qb_00;
      in_XMM1._0_8_ = extraout_XMM1_Qa_00;
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) goto LAB_007c28ac;
      *puVar7 = 0;
      __s = (int *)0x0;
      uVar4 = local_34;
    }
  }
  local_68 = (undefined1  [8])&WeakRefDictionaryEntry<Js::EntryPointInfo,unsigned_char>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_18ff27;
  data.filename._0_4_ = 0x1be;
  data.plusSize = uVar11;
  pRVar6 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_68);
  if (uVar4 == 0) {
    Memory::Recycler::ClearTrackAllocInfo(pRVar6,(TrackAllocData *)0x0);
    pWVar8 = (WeakRefDictionaryEntry<Js::EntryPointInfo,_unsigned_char> *)&DAT_00000008;
  }
  else {
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar11;
    sVar12 = 0xffffffffffffffff;
    if (SUB168(auVar16 * ZEXT816(0x18),8) == 0) {
      sVar12 = SUB168(auVar16 * ZEXT816(0x18),0);
    }
    data._32_8_ = __s;
    BVar5 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      in_XMM1._8_8_ = extraout_XMM1_Qb_01;
      in_XMM1._0_8_ = extraout_XMM1_Qa_01;
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_007c28ac;
      *puVar7 = 0;
      uVar4 = local_34;
    }
    if (sVar12 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      in_XMM1._8_8_ = extraout_XMM1_Qb_02;
      in_XMM1._0_8_ = extraout_XMM1_Qa_02;
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fc,"(byteSize != 0 || !TAllocator::FakeZeroLengthArray)",
                         "byteSize != 0 || !TAllocator::FakeZeroLengthArray");
      if (!bVar3) goto LAB_007c28ac;
      *puVar7 = 0;
      uVar4 = local_34;
    }
    pWVar8 = (WeakRefDictionaryEntry<Js::EntryPointInfo,_unsigned_char> *)
             Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                       (pRVar6,sVar12);
    __s = (int *)data._32_8_;
    if (pWVar8 == (WeakRefDictionaryEntry<Js::EntryPointInfo,_unsigned_char> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      in_XMM1._8_8_ = extraout_XMM1_Qb_03;
      in_XMM1._0_8_ = extraout_XMM1_Qa_03;
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) {
LAB_007c28ac:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
      uVar4 = local_34;
    }
    uVar11 = uVar11 * 0x18 - 0x18;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar11;
    uVar13 = SUB164(auVar1 * ZEXT816(0xaaaaaaaaaaaaaaab),8);
    uVar15 = (undefined4)(uVar11 / 0x180000000);
    auVar14._0_8_ = CONCAT44(uVar15,uVar13);
    auVar14._8_4_ = uVar13;
    auVar14._12_4_ = uVar15;
    pTVar9 = &pWVar8->key;
    uVar10 = 0;
    auVar16 = pmovsxbq(in_XMM1,0x100);
    do {
      if ((bool)(~((long)(auVar14._0_8_ >> 4 | 0x8000000000000000) <
                  (long)(uVar10 ^ 0x8000000000000000)) & 1)) {
        pTVar9->ptr = (RecyclerWeakReference<Js::EntryPointInfo> *)0x0;
      }
      auVar17._8_4_ = (int)uVar10;
      auVar17._0_8_ = uVar10;
      auVar17._12_4_ = (int)(uVar10 >> 0x20);
      if ((long)((auVar17._8_8_ | auVar16._8_8_) ^ 0x8000000000000000) <=
          (long)(auVar14._8_8_ >> 4 | 0x8000000000000000)) {
        pTVar9[3] = (RecyclerWeakReference<Js::EntryPointInfo> *)0x0;
      }
      uVar10 = uVar10 + 2;
      pTVar9 = pTVar9 + 6;
    } while ((uVar11 / 0x18 + 2 & 0xfffffffffffffffe) != uVar10);
  }
  if ((__s != (int *)0x0) &&
     (pWVar8 != (WeakRefDictionaryEntry<Js::EntryPointInfo,_unsigned_char> *)0x0)) {
    this->size = uVar4;
    Memory::Recycler::WBSetBit((char *)&this->buckets);
    uVar4 = local_34;
    (this->buckets).ptr = __s;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->buckets);
    if (0 < (int)uVar4) {
      memset(__s,0xff,(ulong)uVar4 << 2);
    }
    Memory::Recycler::WBSetBit((char *)&this->entries);
    (this->entries).ptr = pWVar8;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->entries);
    this->freeList = -1;
    this->modFunctionIndex = local_38;
  }
  return;
}

Assistant:

void Initialize(int capacity)
        {
            int modIndex = UNKNOWN_MOD_INDEX;
            int size = PrimePolicy::GetSize(capacity, &modIndex);

            int* buckets = RecyclerNewArrayLeaf(recycler, int, size);
            EntryType * entries = RecyclerNewArray(recycler, EntryType, size);

            // No need for auto pointers here since these are both recycler
            // allocated objects
            if (buckets != nullptr && entries != nullptr)
            {
                this->size = size;
                this->buckets = buckets;
                for (int i = 0; i < size; i++) buckets[i] = -1;
                this->entries = entries;
                this->freeList = -1;
                this->modFunctionIndex = modIndex;
            }
        }